

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O1

void __thiscall
glcts::ViewportArray::DepthRangeAPI::compareDepthRanges<double>
          (DepthRangeAPI *this,vector<double,_std::allocator<double>_> *left,
          vector<double,_std::allocator<double>_> *right,GLchar *description,bool *out_result)

{
  double *pdVar1;
  pointer pdVar2;
  size_t sVar3;
  ulong uVar4;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  pdVar2 = (left->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((left->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pdVar2) {
    uVar4 = 0;
    do {
      pdVar1 = (right->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start + uVar4;
      if ((pdVar2[uVar4] != *pdVar1) || (NAN(pdVar2[uVar4]) || NAN(*pdVar1))) {
        local_1b0 = (undefined1  [8])((this->super_TestCaseBase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Test case: ",0xb);
        if (description == (GLchar *)0x0) {
          std::ios::clear((int)local_1a8[-3] + (int)(ostringstream *)&local_1a8);
        }
        else {
          sVar3 = strlen(description);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,description,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8," Invalid values [",0x11);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"] ",2);
        std::ostream::_M_insert<double>
                  ((left->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar4]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," ",1);
        std::ostream::_M_insert<double>
                  ((right->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar4]);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        *out_result = false;
      }
      uVar4 = uVar4 + 1;
      pdVar2 = (left->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(left->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2 >> 3));
  }
  return;
}

Assistant:

void DepthRangeAPI::compareDepthRanges(std::vector<T>& left, std::vector<T>& right, const GLchar* description,
									   bool& out_result)
{
	for (size_t i = 0; i < left.size(); ++i)
	{
		if (left[i] != right[i])
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case: " << description
												<< " Invalid values [" << i << "] " << left[i] << " " << right[i]
												<< tcu::TestLog::EndMessage;
			out_result = false;
		}
	}
}